

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::type_is_block_like(Compiler *this,SPIRType *type)

{
  bool bVar1;
  bool bVar2;
  uint index;
  
  bVar1 = type_is_top_level_block(this,type);
  bVar2 = true;
  if (!bVar1) {
    if ((type->basetype == Struct) &&
       (bVar1 = (int)(type->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0
       , bVar1)) {
      bVar2 = ParsedIR::has_member_decoration
                        (&this->ir,(TypeID)(type->super_IVariant).self.id,0,DecorationOffset);
      if (!bVar2) {
        index = 1;
        do {
          bVar1 = index < (uint)(type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size;
          if (!bVar1) goto LAB_002c53c3;
          bVar2 = ParsedIR::has_member_decoration
                            (&this->ir,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset
                            );
          index = index + 1;
        } while (!bVar2);
      }
      if (bVar1) {
        return true;
      }
    }
LAB_002c53c3:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Compiler::type_is_block_like(const SPIRType &type) const
{
	if (type_is_top_level_block(type))
		return true;

	if (type.basetype == SPIRType::Struct)
	{
		// Block-like types may have Offset decorations.
		for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
			if (has_member_decoration(type.self, i, DecorationOffset))
				return true;
	}

	return false;
}